

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

_Bool al_set_path_extension(ALLEGRO_PATH *path,char *extension)

{
  ALLEGRO_USTR *us;
  int start_pos;
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = al_ustr_size(path->filename);
  if (sVar1 != 0) {
    us = path->filename;
    sVar2 = al_ustr_size(us);
    start_pos = al_ustr_rfind_chr(us,(int)sVar2,0x2e);
    if (-1 < start_pos) {
      al_ustr_truncate(path->filename,start_pos);
    }
    al_ustr_append_cstr(path->filename,extension);
  }
  return sVar1 != 0;
}

Assistant:

bool al_set_path_extension(ALLEGRO_PATH *path, char const *extension)
{
   int dot;
   ASSERT(path);

   if (al_ustr_size(path->filename) == 0) {
      return false;
   }

   dot = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (dot >= 0) {
      al_ustr_truncate(path->filename, dot);
   }
   al_ustr_append_cstr(path->filename, extension);
   return true;
}